

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::SectionInfo::SectionInfo
          (SectionInfo *this,SourceLineInfo *_lineInfo,string *_name,string *_description)

{
  string *in_RCX;
  string *in_RDX;
  SourceLineInfo *in_RDI;
  SourceLineInfo *this_00;
  
  this_00 = in_RDI;
  std::__cxx11::string::string((string *)in_RDI,in_RDX);
  std::__cxx11::string::string((string *)&this_00->line,in_RCX);
  SourceLineInfo::SourceLineInfo(this_00,in_RDI);
  return;
}

Assistant:

SectionInfo::SectionInfo
        (   SourceLineInfo const& _lineInfo,
            std::string const& _name,
            std::string const& _description )
    :   name( _name ),
        description( _description ),
        lineInfo( _lineInfo )
    {}